

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int TIFFReadRGBAStripExt(TIFF *tif,uint32_t row,uint32_t *raster,int stop_on_error)

{
  uint32_t h;
  int iVar1;
  char *pcVar2;
  char *fmt;
  uint32_t rowsperstrip;
  TIFFRGBAImage img;
  char emsg [1024];
  uint local_4cc;
  TIFFRGBAImage local_4c8;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar1 = TIFFIsTiled(tif);
  if (iVar1 == 0) {
    TIFFGetFieldDefaulted(tif,0x116,&local_4cc);
    if (row % local_4cc == 0) {
      iVar1 = TIFFRGBAImageOK(tif,local_438);
      if ((iVar1 != 0) &&
         (iVar1 = TIFFRGBAImageBegin(&local_4c8,tif,stop_on_error,local_438), iVar1 != 0)) {
        local_4c8.col_offset = 0;
        h = local_4c8.height - row;
        if (local_4cc + row <= local_4c8.height) {
          h = local_4cc;
        }
        local_4c8.row_offset = row;
        iVar1 = TIFFRGBAImageGet(&local_4c8,raster,local_4c8.width,h);
        TIFFRGBAImageEnd(&local_4c8);
        return iVar1;
      }
      pcVar2 = TIFFFileName(tif);
      TIFFErrorExtR(tif,pcVar2,"%s",local_438);
      return 0;
    }
    pcVar2 = TIFFFileName(tif);
    fmt = "Row passed to TIFFReadRGBAStrip() must be first in a strip.";
  }
  else {
    pcVar2 = TIFFFileName(tif);
    fmt = "Can\'t use TIFFReadRGBAStrip() with tiled file.";
  }
  TIFFErrorExtR(tif,pcVar2,fmt);
  return 0;
}

Assistant:

int TIFFReadRGBAStripExt(TIFF *tif, uint32_t row, uint32_t *raster,
                         int stop_on_error)

{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t rowsperstrip, rows_to_read;

    if (TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBAStrip() with tiled file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    if ((row % rowsperstrip) != 0)
    {
        TIFFErrorExtR(
            tif, TIFFFileName(tif),
            "Row passed to TIFFReadRGBAStrip() must be first in a strip.");
        return (0);
    }

    if (TIFFRGBAImageOK(tif, emsg) &&
        TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {

        img.row_offset = row;
        img.col_offset = 0;

        if (row + rowsperstrip > img.height)
            rows_to_read = img.height - row;
        else
            rows_to_read = rowsperstrip;

        ok = TIFFRGBAImageGet(&img, raster, img.width, rows_to_read);

        TIFFRGBAImageEnd(&img);
    }
    else
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        ok = 0;
    }

    return (ok);
}